

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::PReLU_x86_avx::forward_inplace(PReLU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  uint *puVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  float *ptr;
  int iVar23;
  int iVar24;
  long lVar25;
  undefined1 (*pauVar26) [16];
  undefined1 (*pauVar27) [32];
  uint uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [28];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  
  auVar7 = _DAT_005f07e0;
  auVar6 = _DAT_005f07c0;
  auVar31 = in_ZMM5._0_16_;
  iVar23 = bottom_top_blob->elempack;
  iVar18 = bottom_top_blob->dims;
  iVar24 = bottom_top_blob->w;
  uVar28 = bottom_top_blob->h;
  uVar22 = bottom_top_blob->c;
  if (iVar18 == 3) {
    if (0 < (int)uVar22) {
      uVar28 = iVar24 * iVar23 * uVar28;
      auVar45 = ZEXT816(0) << 0x40;
      auVar34._8_8_ = 0x8000000000000000;
      auVar34._0_8_ = 0x8000000000000000;
      auVar31 = vpcmpeqd_avx(auVar31,auVar31);
      auVar37._8_4_ = 0xffff;
      auVar37._0_8_ = 0xffff0000ffff;
      auVar37._12_4_ = 0xffff;
      auVar37._16_4_ = 0xffff;
      auVar37._20_4_ = 0xffff;
      auVar37._24_4_ = 0xffff;
      auVar37._28_4_ = 0xffff;
      uVar29 = 0;
      do {
        iVar18 = (this->super_PReLU).num_slope;
        uVar17 = uVar29 & 0xffffffff;
        if (iVar18 < 2) {
          uVar17 = 0;
        }
        uVar3 = *(uint *)((long)(this->super_PReLU).slope_data.data + uVar17 * 4);
        if (iVar18 < 2 || iVar23 != 4) {
          auVar33 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
        }
        else {
          auVar33 = *(undefined1 (*) [16])
                     ((long)(this->super_PReLU).slope_data.data + uVar29 * 0x10);
        }
        if (iVar23 == 8 && 1 < iVar18) {
          auVar41 = SUB3228(*(undefined1 (*) [32])
                             ((long)(this->super_PReLU).slope_data.data + uVar29 * 0x20),0);
        }
        else {
          auVar44._16_16_ = auVar33;
          auVar44._0_16_ = auVar33;
          auVar41 = auVar44._0_28_;
        }
        pauVar27 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar29 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar19 = 0;
        if (7 < (int)uVar28) {
          iVar18 = 7;
          do {
            auVar42 = vmaxps_avx(*pauVar27,ZEXT1632(auVar45));
            auVar8 = vminps_avx(*pauVar27,ZEXT1632(auVar45));
            auVar49._0_4_ = auVar8._0_4_ * auVar41._0_4_ + auVar42._0_4_;
            auVar49._4_4_ = auVar8._4_4_ * auVar41._4_4_ + auVar42._4_4_;
            auVar49._8_4_ = auVar8._8_4_ * auVar41._8_4_ + auVar42._8_4_;
            auVar49._12_4_ = auVar8._12_4_ * auVar41._12_4_ + auVar42._12_4_;
            auVar49._16_4_ = auVar8._16_4_ * auVar41._16_4_ + auVar42._16_4_;
            auVar49._20_4_ = auVar8._20_4_ * auVar41._20_4_ + auVar42._20_4_;
            auVar49._24_4_ = auVar8._24_4_ * auVar41._24_4_ + auVar42._24_4_;
            auVar49._28_4_ = auVar8._28_4_ + auVar42._28_4_;
            *pauVar27 = auVar49;
            pauVar27 = pauVar27 + 1;
            iVar18 = iVar18 + 8;
            uVar19 = uVar28 & 0xfffffff8;
          } while (iVar18 < (int)uVar28);
        }
        uVar21 = uVar19 | 3;
        while ((int)uVar21 < (int)uVar28) {
          auVar32 = vmaxps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0) << 0x40);
          auVar35 = vminps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0) << 0x40);
          *(float *)*pauVar27 = auVar35._0_4_ * auVar33._0_4_ + auVar32._0_4_;
          *(float *)(*pauVar27 + 4) = auVar35._4_4_ * auVar33._4_4_ + auVar32._4_4_;
          *(float *)(*pauVar27 + 8) = auVar35._8_4_ * auVar33._8_4_ + auVar32._8_4_;
          *(float *)(*pauVar27 + 0xc) = auVar35._12_4_ * auVar33._12_4_ + auVar32._12_4_;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar21 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar28) {
          uVar17 = CONCAT44(0,~uVar19 + uVar28);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar17;
          auVar35 = vpshufd_avx(auVar40,0x44);
          auVar38 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          auVar33 = vorps_avx(auVar35,auVar34);
          auVar32 = vorps_avx(auVar35,auVar34);
          uVar20 = 0;
          do {
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar20;
            auVar55 = vpshufd_avx(auVar53,0x44);
            auVar59._16_16_ = auVar55;
            auVar59._0_16_ = auVar55;
            auVar42 = vorps_avx(auVar59,auVar6);
            auVar8 = vorps_avx(auVar59,auVar7);
            auVar55 = vorps_avx(auVar35,auVar34);
            auVar70._0_8_ = auVar8._16_8_ ^ 0x8000000000000000;
            auVar70._8_4_ = auVar8._24_4_;
            auVar70._12_4_ = auVar8._28_4_ ^ 0x80000000;
            auVar52 = vpcmpgtq_avx(auVar70,auVar55);
            auVar54._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
            auVar54._8_4_ = auVar8._8_4_;
            auVar54._12_4_ = auVar8._12_4_ ^ 0x80000000;
            auVar67 = vpcmpgtq_avx(auVar54,auVar33);
            auVar52 = vpackssdw_avx(auVar67,auVar52);
            auVar71._0_8_ = auVar42._16_8_ ^ 0x8000000000000000;
            auVar71._8_4_ = auVar42._24_4_;
            auVar71._12_4_ = auVar42._28_4_ ^ 0x80000000;
            auVar55 = vpcmpgtq_avx(auVar71,auVar55);
            auVar64._0_8_ = auVar42._0_8_ ^ 0x8000000000000000;
            auVar64._8_4_ = auVar42._8_4_;
            auVar64._12_4_ = auVar42._12_4_ ^ 0x80000000;
            auVar67 = vpcmpgtq_avx(auVar64,auVar32);
            auVar55 = vpackssdw_avx(auVar67,auVar55);
            auVar55 = vpackssdw_avx(auVar55 ^ auVar31,auVar52 ^ auVar31);
            auVar52 = vpmovsxwd_avx(auVar55);
            auVar67 = vpunpckhwd_avx(auVar55,auVar55);
            auVar66._16_16_ = auVar67;
            auVar66._0_16_ = auVar52;
            auVar8 = vmaskmovps_avx(auVar66,*(undefined1 (*) [32])(*pauVar27 + uVar20 * 4));
            auVar42 = vcmpps_avx(auVar8,ZEXT1632(auVar45),1);
            auVar42 = vandps_avx(auVar42,auVar37);
            auVar52 = vpackusdw_avx(auVar42._0_16_,auVar42._16_16_);
            auVar55 = vpand_avx(auVar55,auVar52);
            auVar52 = vpmovzxwd_avx(auVar55);
            auVar52 = vpslld_avx(auVar52,0x1f);
            auVar55 = vpunpckhwd_avx(auVar55,auVar55);
            auVar55 = vpslld_avx(auVar55,0x1f);
            auVar60._16_16_ = auVar55;
            auVar60._0_16_ = auVar52;
            auVar10._4_4_ = auVar8._4_4_ * auVar38._4_4_;
            auVar10._0_4_ = auVar8._0_4_ * auVar38._0_4_;
            auVar10._8_4_ = auVar8._8_4_ * auVar38._8_4_;
            auVar10._12_4_ = auVar8._12_4_ * auVar38._12_4_;
            auVar10._16_4_ = auVar8._16_4_ * auVar38._0_4_;
            auVar10._20_4_ = auVar8._20_4_ * auVar38._4_4_;
            auVar10._24_4_ = auVar8._24_4_ * auVar38._8_4_;
            auVar10._28_4_ = auVar8._28_4_;
            auVar42 = vmaskmovps_avx(auVar60,auVar10);
            *(undefined1 (*) [32])(*pauVar27 + uVar20 * 4) = auVar42;
            uVar20 = uVar20 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar20);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar22);
    }
  }
  else if (iVar18 == 2) {
    if (0 < (int)uVar28) {
      uVar22 = iVar23 * iVar24;
      auVar45 = ZEXT816(0) << 0x40;
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      auVar31 = vpcmpeqd_avx(auVar31,auVar31);
      auVar36._8_4_ = 0xffff;
      auVar36._0_8_ = 0xffff0000ffff;
      auVar36._12_4_ = 0xffff;
      auVar36._16_4_ = 0xffff;
      auVar36._20_4_ = 0xffff;
      auVar36._24_4_ = 0xffff;
      auVar36._28_4_ = 0xffff;
      uVar29 = 0;
      do {
        iVar18 = (this->super_PReLU).num_slope;
        uVar17 = uVar29 & 0xffffffff;
        if (iVar18 < 2) {
          uVar17 = 0;
        }
        uVar3 = *(uint *)((long)(this->super_PReLU).slope_data.data + uVar17 * 4);
        if (iVar18 < 2 || iVar23 != 4) {
          auVar32 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
        }
        else {
          auVar32 = *(undefined1 (*) [16])
                     ((long)(this->super_PReLU).slope_data.data + uVar29 * 0x10);
        }
        if (iVar23 == 8 && 1 < iVar18) {
          auVar41 = SUB3228(*(undefined1 (*) [32])
                             ((long)(this->super_PReLU).slope_data.data + uVar29 * 0x20),0);
        }
        else {
          auVar43._16_16_ = auVar32;
          auVar43._0_16_ = auVar32;
          auVar41 = auVar43._0_28_;
        }
        pauVar27 = (undefined1 (*) [32])
                   ((long)bottom_top_blob->w * uVar29 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar19 = 0;
        if (7 < (int)uVar22) {
          iVar18 = 7;
          do {
            auVar42 = vmaxps_avx(*pauVar27,ZEXT1632(auVar45));
            auVar8 = vminps_avx(*pauVar27,ZEXT1632(auVar45));
            auVar48._0_4_ = auVar8._0_4_ * auVar41._0_4_ + auVar42._0_4_;
            auVar48._4_4_ = auVar8._4_4_ * auVar41._4_4_ + auVar42._4_4_;
            auVar48._8_4_ = auVar8._8_4_ * auVar41._8_4_ + auVar42._8_4_;
            auVar48._12_4_ = auVar8._12_4_ * auVar41._12_4_ + auVar42._12_4_;
            auVar48._16_4_ = auVar8._16_4_ * auVar41._16_4_ + auVar42._16_4_;
            auVar48._20_4_ = auVar8._20_4_ * auVar41._20_4_ + auVar42._20_4_;
            auVar48._24_4_ = auVar8._24_4_ * auVar41._24_4_ + auVar42._24_4_;
            auVar48._28_4_ = auVar8._28_4_ + auVar42._28_4_;
            *pauVar27 = auVar48;
            pauVar27 = pauVar27 + 1;
            iVar18 = iVar18 + 8;
            uVar19 = uVar22 & 0xfffffff8;
          } while (iVar18 < (int)uVar22);
        }
        uVar21 = uVar19 | 3;
        while ((int)uVar21 < (int)uVar22) {
          auVar35 = vmaxps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0) << 0x40);
          auVar38 = vminps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0) << 0x40);
          *(float *)*pauVar27 = auVar38._0_4_ * auVar32._0_4_ + auVar35._0_4_;
          *(float *)(*pauVar27 + 4) = auVar38._4_4_ * auVar32._4_4_ + auVar35._4_4_;
          *(float *)(*pauVar27 + 8) = auVar38._8_4_ * auVar32._8_4_ + auVar35._8_4_;
          *(float *)(*pauVar27 + 0xc) = auVar38._12_4_ * auVar32._12_4_ + auVar35._12_4_;
          pauVar27 = (undefined1 (*) [32])(*pauVar27 + 0x10);
          uVar21 = uVar19 + 7;
          uVar19 = uVar19 + 4;
        }
        if ((int)uVar19 < (int)uVar22) {
          uVar17 = CONCAT44(0,~uVar19 + uVar22);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = uVar17;
          auVar38 = vpshufd_avx(auVar39,0x44);
          auVar55 = vshufps_avx(ZEXT416(uVar3),ZEXT416(uVar3),0);
          auVar32 = vorps_avx(auVar38,auVar33);
          auVar35 = vorps_avx(auVar38,auVar33);
          uVar20 = 0;
          do {
            auVar50._8_8_ = 0;
            auVar50._0_8_ = uVar20;
            auVar52 = vpshufd_avx(auVar50,0x44);
            auVar57._16_16_ = auVar52;
            auVar57._0_16_ = auVar52;
            auVar42 = vorps_avx(auVar57,auVar6);
            auVar8 = vorps_avx(auVar57,auVar7);
            auVar52 = vorps_avx(auVar38,auVar33);
            auVar68._0_8_ = auVar8._16_8_ ^ 0x8000000000000000;
            auVar68._8_4_ = auVar8._24_4_;
            auVar68._12_4_ = auVar8._28_4_ ^ 0x80000000;
            auVar67 = vpcmpgtq_avx(auVar68,auVar52);
            auVar51._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
            auVar51._8_4_ = auVar8._8_4_;
            auVar51._12_4_ = auVar8._12_4_ ^ 0x80000000;
            auVar61 = vpcmpgtq_avx(auVar51,auVar32);
            auVar67 = vpackssdw_avx(auVar61,auVar67);
            auVar69._0_8_ = auVar42._16_8_ ^ 0x8000000000000000;
            auVar69._8_4_ = auVar42._24_4_;
            auVar69._12_4_ = auVar42._28_4_ ^ 0x80000000;
            auVar52 = vpcmpgtq_avx(auVar69,auVar52);
            auVar63._0_8_ = auVar42._0_8_ ^ 0x8000000000000000;
            auVar63._8_4_ = auVar42._8_4_;
            auVar63._12_4_ = auVar42._12_4_ ^ 0x80000000;
            auVar61 = vpcmpgtq_avx(auVar63,auVar35);
            auVar52 = vpackssdw_avx(auVar61,auVar52);
            auVar52 = vpackssdw_avx(auVar52 ^ auVar31,auVar67 ^ auVar31);
            auVar67 = vpmovsxwd_avx(auVar52);
            auVar61 = vpunpckhwd_avx(auVar52,auVar52);
            auVar65._16_16_ = auVar61;
            auVar65._0_16_ = auVar67;
            auVar8 = vmaskmovps_avx(auVar65,*(undefined1 (*) [32])(*pauVar27 + uVar20 * 4));
            auVar42 = vcmpps_avx(auVar8,ZEXT1632(auVar45),1);
            auVar42 = vandps_avx(auVar42,auVar36);
            auVar67 = vpackusdw_avx(auVar42._0_16_,auVar42._16_16_);
            auVar52 = vpand_avx(auVar52,auVar67);
            auVar67 = vpmovzxwd_avx(auVar52);
            auVar67 = vpslld_avx(auVar67,0x1f);
            auVar52 = vpunpckhwd_avx(auVar52,auVar52);
            auVar52 = vpslld_avx(auVar52,0x1f);
            auVar58._16_16_ = auVar52;
            auVar58._0_16_ = auVar67;
            auVar9._4_4_ = auVar8._4_4_ * auVar55._4_4_;
            auVar9._0_4_ = auVar8._0_4_ * auVar55._0_4_;
            auVar9._8_4_ = auVar8._8_4_ * auVar55._8_4_;
            auVar9._12_4_ = auVar8._12_4_ * auVar55._12_4_;
            auVar9._16_4_ = auVar8._16_4_ * auVar55._0_4_;
            auVar9._20_4_ = auVar8._20_4_ * auVar55._4_4_;
            auVar9._24_4_ = auVar8._24_4_ * auVar55._8_4_;
            auVar9._28_4_ = auVar8._28_4_;
            auVar42 = vmaskmovps_avx(auVar58,auVar9);
            *(undefined1 (*) [32])(*pauVar27 + uVar20 * 4) = auVar42;
            uVar20 = uVar20 + 8;
          } while ((uVar17 + 8 & 0x1fffffff8) != uVar20);
        }
        uVar29 = uVar29 + 1;
      } while (uVar29 != uVar28);
    }
  }
  else if (iVar18 == 1) {
    iVar23 = iVar23 * iVar24;
    pauVar27 = (undefined1 (*) [32])bottom_top_blob->data;
    puVar4 = (uint *)(this->super_PReLU).slope_data.data;
    if ((this->super_PReLU).num_slope < 2) {
      uVar28 = *puVar4;
      iVar18 = iVar23 + 7;
      if (-1 < iVar23) {
        iVar18 = iVar23;
      }
      uVar22 = iVar18 >> 3;
      if (7 < iVar23) {
        auVar31 = vshufps_avx(ZEXT416(uVar28),ZEXT416(uVar28),0);
        uVar29 = (ulong)uVar22;
        pauVar30 = pauVar27;
        do {
          auVar6 = vmaxps_avx(*pauVar30,ZEXT1632(ZEXT816(0) << 0x40));
          auVar7 = vminps_avx(*pauVar30,ZEXT1632(ZEXT816(0) << 0x40));
          *(float *)*pauVar30 = auVar7._0_4_ * auVar31._0_4_ + auVar6._0_4_;
          *(float *)(*pauVar30 + 4) = auVar7._4_4_ * auVar31._4_4_ + auVar6._4_4_;
          *(float *)(*pauVar30 + 8) = auVar7._8_4_ * auVar31._8_4_ + auVar6._8_4_;
          *(float *)(*pauVar30 + 0xc) = auVar7._12_4_ * auVar31._12_4_ + auVar6._12_4_;
          *(float *)(*pauVar30 + 0x10) = auVar7._16_4_ * auVar31._0_4_ + auVar6._16_4_;
          *(float *)(*pauVar30 + 0x14) = auVar7._20_4_ * auVar31._4_4_ + auVar6._20_4_;
          *(float *)(*pauVar30 + 0x18) = auVar7._24_4_ * auVar31._8_4_ + auVar6._24_4_;
          *(float *)(*pauVar30 + 0x1c) = auVar7._28_4_ + auVar6._28_4_;
          pauVar30 = pauVar30 + 1;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      iVar24 = iVar23 + uVar22 * -8;
      iVar18 = iVar24 + 3;
      if (-1 < iVar24) {
        iVar18 = iVar24;
      }
      auVar31 = ZEXT416(uVar28);
      if (3 < iVar24) {
        auVar45 = vshufps_avx(auVar31,auVar31,0);
        uVar29 = (ulong)(uint)(iVar18 >> 2);
        pauVar26 = (undefined1 (*) [16])(*pauVar27 + (long)(int)(uVar22 * 8) * 4);
        do {
          auVar33 = vmaxps_avx(*pauVar26,ZEXT816(0) << 0x40);
          auVar32 = vminps_avx(*pauVar26,ZEXT816(0) << 0x40);
          *(float *)*pauVar26 = auVar32._0_4_ * auVar45._0_4_ + auVar33._0_4_;
          *(float *)(*pauVar26 + 4) = auVar32._4_4_ * auVar45._4_4_ + auVar33._4_4_;
          *(float *)(*pauVar26 + 8) = auVar32._8_4_ * auVar45._8_4_ + auVar33._8_4_;
          *(float *)(*pauVar26 + 0xc) = auVar32._12_4_ * auVar45._12_4_ + auVar33._12_4_;
          pauVar26 = pauVar26 + 1;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      auVar7 = _DAT_005f07e0;
      auVar6 = _DAT_005f07c0;
      iVar18 = uVar22 * 8 + (iVar18 >> 2) * 4;
      if (iVar18 < iVar23) {
        lVar25 = (long)iVar18;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (iVar23 - lVar25) - 1;
        auVar45 = vpshufd_avx(auVar45,0x44);
        auVar33 = vshufps_avx(auVar31,auVar31,0);
        uVar17 = 0;
        uVar29 = auVar45._0_8_;
        auVar32._0_8_ = uVar29 ^ 0x8000000000000000;
        auVar32._8_4_ = auVar45._8_4_;
        uVar28 = auVar45._12_4_;
        auVar32._12_4_ = uVar28 ^ 0x80000000;
        auVar35._0_8_ = uVar29 ^ 0x8000000000000000;
        auVar35._8_4_ = auVar32._8_4_;
        auVar35._12_4_ = uVar28 ^ 0x80000000;
        auVar31 = vpcmpeqd_avx(in_ZMM6._0_16_,in_ZMM6._0_16_);
        auVar38._0_8_ = uVar29 ^ 0x8000000000000000;
        auVar38._8_4_ = auVar32._8_4_;
        auVar38._12_4_ = uVar28 ^ 0x80000000;
        auVar42._8_4_ = 0xffff;
        auVar42._0_8_ = 0xffff0000ffff;
        auVar42._12_4_ = 0xffff;
        auVar42._16_4_ = 0xffff;
        auVar42._20_4_ = 0xffff;
        auVar42._24_4_ = 0xffff;
        auVar42._28_4_ = 0xffff;
        do {
          auVar55._8_8_ = 0;
          auVar55._0_8_ = uVar17;
          auVar45 = vpshufd_avx(auVar55,0x44);
          auVar46._16_16_ = auVar45;
          auVar46._0_16_ = auVar45;
          auVar8 = vorps_avx(auVar46,auVar6);
          auVar46 = vorps_avx(auVar46,auVar7);
          auVar61._0_8_ = auVar46._16_8_ ^ 0x8000000000000000;
          auVar61._8_4_ = auVar46._24_4_;
          auVar61._12_4_ = auVar46._28_4_ ^ 0x80000000;
          auVar45 = vpcmpgtq_avx(auVar61,auVar32);
          auVar52._0_8_ = auVar46._0_8_ ^ 0x8000000000000000;
          auVar52._8_4_ = auVar46._8_4_;
          auVar52._12_4_ = auVar46._12_4_ ^ 0x80000000;
          auVar55 = vpcmpgtq_avx(auVar52,auVar35);
          auVar45 = vpackssdw_avx(auVar55,auVar45);
          auVar62._0_8_ = auVar8._16_8_ ^ 0x8000000000000000;
          auVar62._8_4_ = auVar8._24_4_;
          auVar62._12_4_ = auVar8._28_4_ ^ 0x80000000;
          auVar55 = vpcmpgtq_avx(auVar62,auVar32);
          auVar67._0_8_ = auVar8._0_8_ ^ 0x8000000000000000;
          auVar67._8_4_ = auVar8._8_4_;
          auVar67._12_4_ = auVar8._12_4_ ^ 0x80000000;
          auVar52 = vpcmpgtq_avx(auVar67,auVar38);
          auVar55 = vpackssdw_avx(auVar52,auVar55);
          auVar45 = vpackssdw_avx(auVar55 ^ auVar31,auVar45 ^ auVar31);
          auVar55 = vpmovsxwd_avx(auVar45);
          auVar52 = vpunpckhwd_avx(auVar45,auVar45);
          auVar56._16_16_ = auVar52;
          auVar56._0_16_ = auVar55;
          auVar46 = vmaskmovps_avx(auVar56,*(undefined1 (*) [32])
                                            (*pauVar27 + uVar17 * 4 + lVar25 * 4));
          auVar8 = vcmpps_avx(auVar46,ZEXT1632(ZEXT816(0) << 0x40),1);
          auVar8 = vandps_avx(auVar8,auVar42);
          auVar55 = vpackusdw_avx(auVar8._0_16_,auVar8._16_16_);
          auVar45 = vpand_avx(auVar45,auVar55);
          auVar55 = vpmovzxwd_avx(auVar45);
          auVar55 = vpslld_avx(auVar55,0x1f);
          auVar45 = vpunpckhwd_avx(auVar45,auVar45);
          auVar45 = vpslld_avx(auVar45,0x1f);
          auVar47._16_16_ = auVar45;
          auVar47._0_16_ = auVar55;
          auVar8._4_4_ = auVar46._4_4_ * auVar33._4_4_;
          auVar8._0_4_ = auVar46._0_4_ * auVar33._0_4_;
          auVar8._8_4_ = auVar46._8_4_ * auVar33._8_4_;
          auVar8._12_4_ = auVar46._12_4_ * auVar33._12_4_;
          auVar8._16_4_ = auVar46._16_4_ * auVar33._0_4_;
          auVar8._20_4_ = auVar46._20_4_ * auVar33._4_4_;
          auVar8._24_4_ = auVar46._24_4_ * auVar33._8_4_;
          auVar8._28_4_ = auVar46._28_4_;
          auVar8 = vmaskmovps_avx(auVar47,auVar8);
          *(undefined1 (*) [32])(*pauVar27 + uVar17 * 4 + lVar25 * 4) = auVar8;
          uVar17 = uVar17 + 8;
        } while (((iVar23 - lVar25) + 7U & 0xfffffffffffffff8) != uVar17);
      }
    }
    else {
      iVar18 = iVar23 + 7;
      if (-1 < iVar23) {
        iVar18 = iVar23;
      }
      uVar28 = iVar18 >> 3;
      if (7 < iVar23) {
        uVar29 = (ulong)uVar28;
        lVar25 = 0;
        do {
          auVar6 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar27 + lVar25),
                              ZEXT1632(ZEXT816(0) << 0x40));
          auVar7 = vminps_avx(*(undefined1 (*) [32])(*pauVar27 + lVar25),
                              ZEXT1632(ZEXT816(0) << 0x40));
          pfVar1 = (float *)((long)puVar4 + lVar25);
          fVar11 = pfVar1[1];
          fVar12 = pfVar1[2];
          fVar13 = pfVar1[3];
          fVar14 = pfVar1[4];
          fVar15 = pfVar1[5];
          fVar16 = pfVar1[6];
          pfVar2 = (float *)(*pauVar27 + lVar25);
          *pfVar2 = auVar7._0_4_ * *pfVar1 + auVar6._0_4_;
          pfVar2[1] = auVar7._4_4_ * fVar11 + auVar6._4_4_;
          pfVar2[2] = auVar7._8_4_ * fVar12 + auVar6._8_4_;
          pfVar2[3] = auVar7._12_4_ * fVar13 + auVar6._12_4_;
          pfVar2[4] = auVar7._16_4_ * fVar14 + auVar6._16_4_;
          pfVar2[5] = auVar7._20_4_ * fVar15 + auVar6._20_4_;
          pfVar2[6] = auVar7._24_4_ * fVar16 + auVar6._24_4_;
          pfVar2[7] = auVar7._28_4_ + auVar6._28_4_;
          lVar25 = lVar25 + 0x20;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      iVar24 = iVar23 + uVar28 * -8;
      iVar18 = iVar24 + 3;
      if (-1 < iVar24) {
        iVar18 = iVar24;
      }
      uVar29 = (ulong)(uint)(iVar18 >> 2);
      if (3 < iVar24) {
        lVar25 = (long)(int)(uVar28 * 8) << 2;
        do {
          auVar31 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar27 + lVar25),ZEXT816(0) << 0x40);
          auVar45 = vminps_avx(*(undefined1 (*) [16])(*pauVar27 + lVar25),ZEXT816(0) << 0x40);
          pfVar1 = (float *)((long)puVar4 + lVar25);
          fVar11 = pfVar1[1];
          fVar12 = pfVar1[2];
          fVar13 = pfVar1[3];
          pfVar2 = (float *)(*pauVar27 + lVar25);
          *pfVar2 = auVar45._0_4_ * *pfVar1 + auVar31._0_4_;
          pfVar2[1] = auVar45._4_4_ * fVar11 + auVar31._4_4_;
          pfVar2[2] = auVar45._8_4_ * fVar12 + auVar31._8_4_;
          pfVar2[3] = auVar45._12_4_ * fVar13 + auVar31._12_4_;
          lVar25 = lVar25 + 0x10;
          uVar29 = uVar29 - 1;
        } while (uVar29 != 0);
      }
      iVar18 = uVar28 * 8 + (iVar18 >> 2) * 4;
      if (iVar18 < iVar23) {
        pvVar5 = (this->super_PReLU).slope_data.data;
        lVar25 = (long)iVar18;
        do {
          if (*(float *)(*pauVar27 + lVar25 * 4) < 0.0) {
            *(float *)(*pauVar27 + lVar25 * 4) =
                 *(float *)(*pauVar27 + lVar25 * 4) * *(float *)((long)pvVar5 + lVar25 * 4);
          }
          lVar25 = lVar25 + 1;
        } while (lVar25 < iVar23);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_loadu_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}